

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abi_test.cc
# Opt level: O0

string * __thiscall
abi_test::internal::FixVAArgsString_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *str)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  ulong local_68;
  size_t idx2;
  ulong local_58;
  size_t idx;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string ret;
  char *str_local;
  
  ret.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,(char *)this,&local_39);
  std::allocator<char>::~allocator(&local_39);
  local_58 = std::__cxx11::string::find((char)local_38,0x2c);
  uVar1 = local_58;
  if (local_58 == 0xffffffffffffffff) {
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   "()");
  }
  else {
    do {
      local_68 = uVar1 + 1;
      uVar1 = local_68;
      uVar2 = std::__cxx11::string::size();
      bVar4 = false;
      if (uVar1 < uVar2) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
        bVar4 = *pcVar3 == ' ';
      }
      uVar1 = local_68;
    } while (bVar4);
    while( true ) {
      bVar4 = false;
      if (local_58 != 0) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
        bVar4 = *pcVar3 == ' ';
      }
      if (!bVar4) break;
      local_58 = local_58 - 1;
    }
    std::__cxx11::string::substr((ulong)&local_c8,(ulong)local_38);
    std::operator+(&local_a8,&local_c8,"(");
    std::__cxx11::string::substr((ulong)&local_e8,(ulong)local_38);
    std::operator+(&local_88,&local_a8,&local_e8);
    std::operator+(__return_storage_ptr__,&local_88,")");
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  idx2._4_4_ = 1;
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string FixVAArgsString(const char *str) {
  std::string ret = str;
  size_t idx = ret.find(',');
  if (idx == std::string::npos) {
    return ret + "()";
  }
  size_t idx2 = idx + 1;
  while (idx2 < ret.size() && ret[idx2] == ' ') {
    idx2++;
  }
  while (idx > 0 && ret[idx - 1] == ' ') {
    idx--;
  }
  return ret.substr(0, idx) + "(" + ret.substr(idx2) + ")";
}